

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t * extents_first_fit_locked(tsdn_t *tsdn,arena_t *arena,extents_t *extents,size_t size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  extent_t *a;
  ulong in_RCX;
  long in_RDX;
  _Bool size_ok;
  extent_t *extent;
  pszind_t i;
  pszind_t pind;
  extent_t *ret;
  pszind_t ind;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  byte local_74;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  extent_t *bitmap;
  undefined4 in_stack_fffffffffffffff8;
  int iVar5;
  
  bitmap = (extent_t *)0x0;
  sVar4 = extent_size_quantize_ceil(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (sVar4 < 0x7000000000000001) {
    uVar1 = lg_floor(sVar4 * 2 - 1);
    if (uVar1 < 0xe) {
      in_stack_ffffffffffffff90 = 0;
    }
    else {
      in_stack_ffffffffffffff90 = uVar1 - 0xe;
    }
    if (uVar1 < 0xf) {
      local_74 = 0xc;
    }
    else {
      local_74 = (char)uVar1 - 3;
    }
    iVar2 = in_stack_ffffffffffffff90 * 4 +
            ((uint)((sVar4 - 1 & -1L << (local_74 & 0x3f)) >> (local_74 & 0x3f)) & 3);
  }
  else {
    iVar2 = 199;
  }
  iVar5 = iVar2;
  sVar4 = bitmap_ffu(&bitmap->e_bits,(bitmap_info_t *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  uVar1 = (uint)sVar4;
  while( true ) {
    if (199 < uVar1) {
      return bitmap;
    }
    a = extent_heap_first((extent_heap_t *)CONCAT44(iVar5,in_stack_fffffffffffffff8));
    in_stack_ffffffffffffff94 = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
    if (((*(byte *)(in_RDX + 0x1364) & 1) != 0) &&
       (sVar4 = sz_pind2sz(0), in_RCX < sVar4 >> ((byte)opt_lg_extent_max_active_fit & 0x3f))) {
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff;
    }
    if (((in_stack_ffffffffffffff94 & 0x1000000) != 0) &&
       ((bitmap == (extent_t *)0x0 ||
        (iVar3 = extent_snad_comp(a,(extent_t *)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
        iVar3 < 0)))) {
      bitmap = a;
    }
    if (uVar1 == 199) break;
    sVar4 = bitmap_ffu(&bitmap->e_bits,(bitmap_info_t *)CONCAT44(iVar2,uVar1),(size_t)a);
    uVar1 = (uint)sVar4;
  }
  return bitmap;
}

Assistant:

static extent_t *
extents_first_fit_locked(tsdn_t *tsdn, arena_t *arena, extents_t *extents,
    size_t size) {
	extent_t *ret = NULL;

	pszind_t pind = sz_psz2ind(extent_size_quantize_ceil(size));
	for (pszind_t i = (pszind_t)bitmap_ffu(extents->bitmap,
	    &extents_bitmap_info, (size_t)pind);
	    i < SC_NPSIZES + 1;
	    i = (pszind_t)bitmap_ffu(extents->bitmap, &extents_bitmap_info,
	    (size_t)i+1)) {
		assert(!extent_heap_empty(&extents->heaps[i]));
		extent_t *extent = extent_heap_first(&extents->heaps[i]);
		assert(extent_size_get(extent) >= size);
                bool size_ok = true;
		/*
		 * In order to reduce fragmentation, avoid reusing and splitting
		 * large extents for much smaller sizes.
		 *
		 * Only do check for dirty extents (delay_coalesce).
		 */
		if (extents->delay_coalesce &&
		    (sz_pind2sz(i) >> opt_lg_extent_max_active_fit) > size) {
			size_ok = false;
		}
		if (size_ok &&
		    (ret == NULL || extent_snad_comp(extent, ret) < 0)) {
			ret = extent;
		}
		if (i == SC_NPSIZES) {
			break;
		}
		assert(i < SC_NPSIZES);
	}

	return ret;
}